

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_encoder.cc
# Opt level: O0

void __thiscall draco::RAnsBitEncoder::EncodeBit(RAnsBitEncoder *this,bool bit)

{
  reference pvVar1;
  byte in_SIL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  
  pvVar2 = in_RDI;
  if ((in_SIL & 1) == 0) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,0);
    *pvVar1 = *pvVar1 + 1;
  }
  else {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,1);
    *pvVar1 = *pvVar1 + 1;
    *(uint *)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
         1 << ((byte)*(undefined4 *)
                      ((long)&in_RDI[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) & 0x1f) |
         *(uint *)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  *(int *)((long)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + 4) =
       *(int *)((long)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4) + 1;
  if (*(int *)((long)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 4) == 0x20) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (unaff_retaddr,(value_type_conflict5 *)pvVar2);
    *(undefined4 *)
     ((long)&in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
  }
  return;
}

Assistant:

void RAnsBitEncoder::EncodeBit(bool bit) {
  if (bit) {
    bit_counts_[1]++;
    local_bits_ |= 1 << num_local_bits_;
  } else {
    bit_counts_[0]++;
  }
  num_local_bits_++;

  if (num_local_bits_ == 32) {
    bits_.push_back(local_bits_);
    num_local_bits_ = 0;
    local_bits_ = 0;
  }
}